

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_xz.c
# Opt level: O0

int archive_write_add_filter_xz(archive *_a)

{
  int iVar1;
  archive_write_filter *f_00;
  int magic_test;
  int r;
  archive_write_filter *f;
  char *in_stack_00000078;
  uint in_stack_00000080;
  uint in_stack_00000084;
  archive *in_stack_00000088;
  undefined4 in_stack_ffffffffffffffe4;
  int local_4;
  
  iVar1 = __archive_check_magic
                    (in_stack_00000088,in_stack_00000084,in_stack_00000080,in_stack_00000078);
  if (iVar1 == -0x1e) {
    local_4 = -0x1e;
  }
  else {
    f_00 = __archive_write_allocate_filter((archive *)CONCAT44(in_stack_ffffffffffffffe4,iVar1));
    local_4 = common_setup(f_00);
    if (local_4 == 0) {
      f_00->code = 6;
      f_00->name = "xz";
    }
  }
  return local_4;
}

Assistant:

int
archive_write_add_filter_xz(struct archive *_a)
{
	struct archive_write_filter *f;
	int r;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_add_filter_xz");
	f = __archive_write_allocate_filter(_a);
	r = common_setup(f);
	if (r == ARCHIVE_OK) {
		f->code = ARCHIVE_FILTER_XZ;
		f->name = "xz";
	}
	return (r);
}